

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileWhile(jx9_gen_state *pGen)

{
  undefined8 uVar1;
  SyToken *pBlock;
  sxi32 sVar2;
  sxu32 nFirstInstr;
  sxu32 sVar3;
  bool bVar4;
  sxi32 rc;
  sxu32 nLine;
  sxu32 nFalseJump;
  SyToken *pEnd;
  SyToken *pTmp;
  GenBlock *pWhileBlock;
  jx9_gen_state *pGen_local;
  
  pTmp = (SyToken *)0x0;
  _nLine = (SyToken *)0x0;
  sVar3 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  pWhileBlock = (GenBlock *)pGen;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x200) != 0)) {
    pGen->pIn = pGen->pIn + 1;
    nFirstInstr = jx9VmInstrLength(pGen->pVm);
    sVar2 = GenStateEnterBlock(pGen,1,nFirstInstr,(void *)0x0,(GenBlock **)&pTmp);
    if (sVar2 == 0) {
      jx9DelimitNestedTokens
                (*(SyToken **)&pWhileBlock[2].aPostContFix.eSize,
                 (SyToken *)pWhileBlock[2].aPostContFix.pUserData,0x200,0x400,(SyToken **)&nLine);
      if (((*(SyToken **)&pWhileBlock[2].aPostContFix.eSize == _nLine) ||
          ((SyToken *)pWhileBlock[2].aPostContFix.pUserData <= _nLine)) &&
         (sVar2 = jx9GenCompileError((jx9_gen_state *)pWhileBlock,1,sVar3,
                                     "Expected expression after \'while\' keyword"), sVar2 == -10))
      {
        pGen_local._4_4_ = -10;
      }
      else {
        pEnd = (SyToken *)pWhileBlock[2].aPostContFix.pUserData;
        pWhileBlock[2].aPostContFix.pUserData = _nLine;
        sVar2 = jx9CompileExpr((jx9_gen_state *)pWhileBlock,0,
                               (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        if (sVar2 == -10) {
          pGen_local._4_4_ = -10;
        }
        else {
          while (*(SyToken **)&pWhileBlock[2].aPostContFix.eSize < _nLine) {
            uVar1._0_4_ = pWhileBlock[2].aPostContFix.eSize;
            uVar1._4_4_ = pWhileBlock[2].aPostContFix.nCursor;
            sVar2 = jx9GenCompileError((jx9_gen_state *)pWhileBlock,1,
                                       *(sxu32 *)(*(long *)&pWhileBlock[2].aPostContFix.eSize + 0x14
                                                 ),"Unexpected token \'%z\'",uVar1);
            if (sVar2 == -10) {
              return -10;
            }
            *(long *)&pWhileBlock[2].aPostContFix.eSize =
                 *(long *)&pWhileBlock[2].aPostContFix.eSize + 0x20;
          }
          *(SyToken **)&pWhileBlock[2].aPostContFix.eSize = _nLine + 1;
          pWhileBlock[2].aPostContFix.pUserData = pEnd;
          jx9VmEmitInstr((jx9_vm *)pWhileBlock->pGen,9,0,0,(void *)0x0,(sxu32 *)&rc);
          GenStateNewJumpFixup((GenBlock *)pTmp,9,rc);
          sVar2 = jx9CompileBlock((jx9_gen_state *)pWhileBlock);
          if (sVar2 == -10) {
            pGen_local._4_4_ = -10;
          }
          else {
            jx9VmEmitInstr((jx9_vm *)pWhileBlock->pGen,8,0,pTmp->nType,(void *)0x0,(sxu32 *)0x0);
            pBlock = pTmp;
            sVar3 = jx9VmInstrLength((jx9_vm *)pWhileBlock->pGen);
            GenStateFixJumps((GenBlock *)pBlock,-1,sVar3);
            GenStateLeaveBlock((jx9_gen_state *)pWhileBlock,(GenBlock **)0x0);
            pGen_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      pGen_local._4_4_ = -10;
    }
  }
  else {
    sVar2 = jx9GenCompileError(pGen,1,sVar3,"Expected \'(\' after \'while\' keyword");
    if (sVar2 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
      while( true ) {
        bVar4 = false;
        if (*(void **)&pWhileBlock[2].aPostContFix.eSize < pWhileBlock[2].aPostContFix.pUserData) {
          bVar4 = (*(uint *)(*(long *)&pWhileBlock[2].aPostContFix.eSize + 0x10) & 0x40040) == 0;
        }
        if (!bVar4) break;
        *(long *)&pWhileBlock[2].aPostContFix.eSize =
             *(long *)&pWhileBlock[2].aPostContFix.eSize + 0x20;
      }
      pGen_local._4_4_ = 0;
    }
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 jx9CompileWhile(jx9_gen_state *pGen)
{ 
	GenBlock *pWhileBlock = 0;
	SyToken *pTmp, *pEnd = 0;
	sxu32 nFalseJump;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'while' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'while' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pWhileBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the condition */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected expression after 'while' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	/* Synchronize pointers */
	pGen->pIn  = &pEnd[1];
	pGen->pEnd = pTmp;
	/* Emit the false jump */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pWhileBlock, JX9_OP_JZ, nFalseJump);
	/* Compile the loop body */
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pWhileBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pWhileBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid 
	 * compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}